

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.cc
# Opt level: O1

bool __thiscall
tchecker::variable_access_map_t::has_shared_variable
          (variable_access_map_t *this,variable_type_t vtype)

{
  pointer ppVar1;
  stored_size_type sVar2;
  pointer ppVar3;
  bool bVar4;
  char cVar5;
  
  sVar2 = (this->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_size;
  bVar4 = sVar2 != 0;
  if (bVar4) {
    ppVar3 = (this->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_start;
    ppVar1 = ppVar3 + sVar2;
    do {
      if (ppVar3 == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<std::tuple<unsigned int, tchecker::variable_type_t, tchecker::variable_access_t>, boost::container::flat_set<unsigned int>> *, true>::operator*() const [Pointer = std::pair<std::tuple<unsigned int, tchecker::variable_type_t, tchecker::variable_access_t>, boost::container::flat_set<unsigned int>> *, IsConst = true]"
                     );
      }
      cVar5 = '\x03';
      if (1 < *(stored_size_type *)((long)&ppVar3->second + 8)) {
        cVar5 = ((_Head_base<1UL,_tchecker::variable_type_t,_false> *)((long)&ppVar3->first + 4))->
                _M_head_impl == vtype;
      }
      if ((cVar5 != '\x03') && (cVar5 != '\0')) {
        return bVar4;
      }
      ppVar3 = ppVar3 + 1;
      bVar4 = ppVar3 != ppVar1;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool variable_access_map_t::has_shared_variable(enum tchecker::variable_type_t vtype) const
{
  for (auto && v2pid : _v2p_map) {
    if (v2pid.second.size() <= 1)
      continue;
    auto && [id, type, access] = v2pid.first;
    if (type == vtype)
      return true;
  }
  return false;
}